

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::checkUnwantedModification(CheckerVisitor *this,CallExpr *call)

{
  TreeOp TVar1;
  pointer pSVar2;
  bool bVar3;
  TerExpr *ter;
  SQChar *n;
  Expr *pEVar4;
  long lVar5;
  
  if ((((this->effectsOnly == false) && (n = extractFunctionName(this,call), n != (SQChar *)0x0)) &&
      (bVar3 = nameLooksLikeModifiesObject(n), bVar3)) &&
     ((pEVar4 = call->_callee, (pEVar4->super_Node)._op - TO_GETFIELD < 4 &&
      ((pSVar2 = (this->nodeStack).
                 super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                 ._M_impl.super__Vector_impl_data._M_finish, pSVar2[-1].sst != SST_NODE ||
       ((pSVar2[-1].field_1.n)->_op != TO_NEWSLOT)))))) {
    do {
      pEVar4 = (Expr *)pEVar4[1].super_Node.super_ArenaObj._vptr_ArenaObj;
      if (pEVar4 == (Expr *)0x0) {
        pEVar4 = (Expr *)0x0;
        break;
      }
    } while ((pEVar4->super_Node)._op == TO_PAREN);
    TVar1 = (pEVar4->super_Node)._op;
    if (TVar1 == TO_NULLC) {
      lVar5 = 0x28;
    }
    else {
      if (TVar1 != TO_TERNARY) {
        return;
      }
      lVar5 = 0x30;
      if (*(int *)(*(long *)&pEVar4[1].super_Node._coordinates + 0x18) - 0x3dU < 2)
      goto LAB_00152814;
    }
    if (*(int *)(*(long *)((long)&(pEVar4->super_Node).super_ArenaObj._vptr_ArenaObj + lVar5) + 0x18
                ) - 0x3dU < 2) {
LAB_00152814:
      report(this,(Node *)call,0x77,n);
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkUnwantedModification(const CallExpr *call) {
  if (effectsOnly)
    return;

  const SQChar *name = extractFunctionName(call);

  if (!name)
    return;

  if (!nameLooksLikeModifiesObject(name))
    return;

  const Expr *callee = call->callee();

  if (!callee->isAccessExpr())
    return;

  if (nodeStack.back().sst == SST_NODE) {
    const Node *p = nodeStack.back().n;
    if (p->op() == TO_NEWSLOT)
      return;
  }

  if (isIndeterminated(callee->asAccessExpr()->receiver()))
    report(call, DiagnosticsId::DI_UNWANTED_MODIFICATION, name);
}